

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

return_type * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__23&>
          (return_type *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar1;
  uint *puVar2;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    puVar2 = (uint *)result_adapter<std::variant<int,std::__cxx11::string>>::
                     get_success<std::variant<int,std::__cxx11::string>>
                               ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this);
    if ((*puVar2 & 1) == 0) {
      *(int *)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> = (int)*puVar2 >> 1;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> + 0x20) = '\0';
    }
    else {
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,char_const(&)[5]>
                ((_Variant_storage<false,int,std::__cxx11::string> *)__return_storage_ptr__,"oops");
    }
  }
  else {
    pvVar1 = result_adapter<std::variant<int,std::__cxx11::string>>::
             get_error<std::variant<int,std::__cxx11::string>>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&_Stack_38,pvVar1);
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&_Stack_38);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&_Stack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }